

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosDistribution>::
createInstance(MSCase<vkt::pipeline::multisample::MSCaseSamplePosDistribution> *this,
              Context *context)

{
  TestInstance *this_00;
  Context *context_local;
  MSCase<vkt::pipeline::multisample::MSCaseSamplePosDistribution> *this_local;
  
  this_00 = (TestInstance *)operator_new(0x30);
  MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution>::MSInstance
            ((MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution> *)this_00,
             context,&(this->super_MSCaseBaseResolveAndPerSampleFetch).super_MultisampleCaseBase.
                      m_imageMSParams);
  return this_00;
}

Assistant:

TestInstance* MSCase<MSCaseSamplePosDistribution>::createInstance (Context& context) const
{
	return new MSInstance<MSInstanceSamplePosDistribution>(context, m_imageMSParams);
}